

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FieldGenerator::SetHasBitIndex
          (FieldGenerator *this,int32_t has_bit_index)

{
  bool bVar1;
  LogMessage *other;
  mapped_type *pmVar2;
  int iVar3;
  Hex hex;
  Hex hex_00;
  AlphaNum *in_stack_fffffffffffffc68;
  allocator local_2f1;
  key_type local_2f0;
  AlphaNum local_2d0;
  undefined1 local_2a0 [12];
  AlphaNum local_290;
  AlphaNum local_260;
  AlphaNum local_230;
  AlphaNum local_200;
  string local_1d0;
  allocator local_1a9;
  key_type local_1a8;
  AlphaNum local_188;
  undefined1 local_158 [12];
  AlphaNum local_148;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  string local_88;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  FieldGenerator *pFStack_10;
  int32_t has_bit_index_local;
  FieldGenerator *this_local;
  
  local_14 = has_bit_index;
  pFStack_10 = this;
  bVar1 = HasHasbit(this->descriptor_);
  if (bVar1) {
    strings::AlphaNum::AlphaNum(&local_b8,"_has_bits_[");
    iVar3 = local_14;
    if (local_14 < 0) {
      iVar3 = local_14 + 0x1f;
    }
    strings::AlphaNum::AlphaNum(&local_e8,iVar3 >> 5);
    strings::AlphaNum::AlphaNum(&local_118,"] |= 0x");
    strings::Hex::Hex<unsigned_int>((Hex *)local_158,1 << ((byte)local_14 & 0x1f),ZERO_PAD_8);
    hex._12_4_ = 0;
    hex.value = local_158._0_8_;
    hex.spec = local_158._8_4_;
    strings::AlphaNum::AlphaNum(&local_148,hex);
    strings::AlphaNum::AlphaNum(&local_188,"u;");
    StrCat_abi_cxx11_(&local_88,(protobuf *)&local_b8,&local_e8,&local_118,&local_148,&local_188,
                      in_stack_fffffffffffffc68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"set_hasbit",&local_1a9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_1a8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    std::__cxx11::string::~string((string *)&local_88);
    strings::AlphaNum::AlphaNum(&local_200,"_has_bits_[");
    iVar3 = local_14;
    if (local_14 < 0) {
      iVar3 = local_14 + 0x1f;
    }
    strings::AlphaNum::AlphaNum(&local_230,iVar3 >> 5);
    strings::AlphaNum::AlphaNum(&local_260,"] &= ~0x");
    strings::Hex::Hex<unsigned_int>((Hex *)local_2a0,1 << ((byte)local_14 & 0x1f),ZERO_PAD_8);
    hex_00._12_4_ = 0;
    hex_00.value = local_2a0._0_8_;
    hex_00.spec = local_2a0._8_4_;
    strings::AlphaNum::AlphaNum(&local_290,hex_00);
    strings::AlphaNum::AlphaNum(&local_2d0,"u;");
    StrCat_abi_cxx11_(&local_1d0,(protobuf *)&local_200,&local_230,&local_260,&local_290,&local_2d0,
                      in_stack_fffffffffffffc68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"clear_hasbit",&local_2f1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->variables_,&local_2f0);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  else {
    local_51 = 0;
    if (local_14 != -1) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_field.cc"
                 ,0x112);
      local_51 = 1;
      other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (has_bit_index) == (-1): ");
      internal::LogFinisher::operator=(local_65,other);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
  }
  return;
}

Assistant:

void FieldGenerator::SetHasBitIndex(int32_t has_bit_index) {
  if (!HasHasbit(descriptor_)) {
    GOOGLE_CHECK_EQ(has_bit_index, -1);
    return;
  }
  variables_["set_hasbit"] = StrCat(
      "_has_bits_[", has_bit_index / 32, "] |= 0x",
      strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8), "u;");
  variables_["clear_hasbit"] = StrCat(
      "_has_bits_[", has_bit_index / 32, "] &= ~0x",
      strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8), "u;");
}